

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCommandArgumentParserHelper.cxx
# Opt level: O3

char * __thiscall
cmCommandArgumentParserHelper::ExpandVariableForAt(cmCommandArgumentParserHelper *this,char *var)

{
  char *pcVar1;
  string ref;
  string local_40;
  
  if (this->ReplaceAtSyntax == true) {
    pcVar1 = ExpandVariable(this,var);
    if (pcVar1 != (char *)0x0) {
      return pcVar1;
    }
    if (this->RemoveEmpty == true) {
      local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"");
      pcVar1 = AddString(this,&local_40);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_40._M_dataplus._M_p == &local_40.field_2) {
        return pcVar1;
      }
      goto LAB_002a6391;
    }
  }
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"@","");
  std::__cxx11::string::append((char *)&local_40);
  std::__cxx11::string::append((char *)&local_40);
  pcVar1 = AddString(this,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p == &local_40.field_2) {
    return pcVar1;
  }
LAB_002a6391:
  operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  return pcVar1;
}

Assistant:

const char* cmCommandArgumentParserHelper::ExpandVariableForAt(const char* var)
{
  if (this->ReplaceAtSyntax) {
    // try to expand the variable
    const char* ret = this->ExpandVariable(var);
    // if the return was 0 and we want to replace empty strings
    // then return an empty string
    if (!ret && this->RemoveEmpty) {
      return this->AddString("");
    }
    // if the ret was not 0, then return it
    if (ret) {
      return ret;
    }
  }
  // at this point we want to put it back because of one of these cases:
  // - this->ReplaceAtSyntax is false
  // - this->ReplaceAtSyntax is true, but this->RemoveEmpty is false,
  //   and the variable was not defined
  std::string ref = "@";
  ref += var;
  ref += "@";
  return this->AddString(ref);
}